

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLCellLinOp.cpp
# Opt level: O0

void __thiscall
amrex::MLCellLinOp::fixSolvabilityByOffset
          (MLCellLinOp *this,int amrlev,int mglev,Any *a_rhs,
          Vector<double,_std::allocator<double>_> *offset)

{
  longdouble x;
  bool bVar1;
  size_type sVar2;
  long *in_RDI;
  literals *this_00;
  Vector<double,_std::allocator<double>_> val;
  int c;
  int ncomp;
  MultiFab *rhs;
  undefined4 in_stack_ffffffffffffff58;
  int ncomp_00;
  int in_stack_ffffffffffffff5c;
  int icomp;
  undefined2 in_stack_ffffffffffffff60;
  undefined2 uVar3;
  undefined2 in_stack_ffffffffffffff62;
  int in_stack_ffffffffffffff64;
  Real in_stack_ffffffffffffff68;
  FabArray<amrex::FArrayBox> *in_stack_ffffffffffffff70;
  Vector<double,_std::allocator<double>_> *this_01;
  Any *in_stack_ffffffffffffff78;
  Vector<double,_std::allocator<double>_> local_61;
  int local_40;
  int local_3c;
  literals *local_38;
  undefined1 local_20 [4];
  undefined1 local_1c [12];
  undefined1 *local_10;
  undefined1 *local_8;
  
  local_8 = local_1c;
  local_10 = local_20;
  local_38 = (literals *)Any::get<amrex::MultiFab>(in_stack_ffffffffffffff78);
  local_3c = (**(code **)(*in_RDI + 0x28))();
  for (local_40 = 0; local_40 < local_3c; local_40 = local_40 + 1) {
    Vector<double,_std::allocator<double>_>::operator[]
              ((Vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_ffffffffffffff64,
                        CONCAT22(in_stack_ffffffffffffff62,in_stack_ffffffffffffff60)),
               CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    MultiFab::plus((MultiFab *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                   in_stack_ffffffffffffff64,
                   CONCAT22(in_stack_ffffffffffffff62,in_stack_ffffffffffffff60),
                   in_stack_ffffffffffffff5c);
  }
  this_00 = local_38;
  bVar1 = FabArray<amrex::FArrayBox>::hasEBFabFactory(in_stack_ffffffffffffff70);
  if (bVar1) {
    sVar2 = (size_type)local_3c;
    x = (longdouble)0;
    ncomp_00 = SUB104(x,0);
    icomp = (int)((unkuint10)x >> 0x20);
    uVar3 = (undefined2)((unkuint10)x >> 0x40);
    local_61.super_vector<double,_std::allocator<double>_>.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._1_8_ =
         literals::operator____rt(this_00,x);
    this_01 = &local_61;
    std::allocator<double>::allocator((allocator<double> *)0x153748e);
    Vector<double,_std::allocator<double>_>::vector
              (this_01,sVar2,
               (value_type_conflict1 *)
               CONCAT44(in_stack_ffffffffffffff64,CONCAT22(in_stack_ffffffffffffff62,uVar3)),
               (allocator_type *)CONCAT44(icomp,ncomp_00));
    std::allocator<double>::~allocator((allocator<double> *)0x15374b3);
    EB_set_covered((MultiFab *)
                   CONCAT44(in_stack_ffffffffffffff64,CONCAT22(in_stack_ffffffffffffff62,uVar3)),
                   icomp,ncomp_00,(Vector<double,_std::allocator<double>_> *)0x15374c8);
    Vector<double,_std::allocator<double>_>::~Vector
              ((Vector<double,_std::allocator<double>_> *)0x15374d4);
  }
  return;
}

Assistant:

void
MLCellLinOp::fixSolvabilityByOffset (int amrlev, int mglev, Any& a_rhs,
                                     Vector<Real> const& offset) const
{
    amrex::ignore_unused(amrlev, mglev);
    AMREX_ASSERT(a_rhs.is<MultiFab>());
    auto& rhs = a_rhs.get<MultiFab>();

    const int ncomp = getNComp();
    for (int c = 0; c < ncomp; ++c) {
        rhs.plus(-offset[c], c, 1);
    }
#ifdef AMREX_USE_EB
    if (rhs.hasEBFabFactory()) {
        Vector<Real> val(ncomp, 0.0_rt);
        amrex::EB_set_covered(rhs, 0, ncomp, val);
    }
#endif
}